

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnCallIndirect
          (SharedValidator *this,Location *loc,Var *sig_var,Var *table_var)

{
  Result rhs;
  Var local_110;
  Enum local_c4;
  Var local_c0;
  Enum local_74;
  undefined1 local_70 [8];
  FuncType func_type;
  Var *table_var_local;
  Var *sig_var_local;
  Location *loc_local;
  SharedValidator *this_local;
  Result result;
  
  Opcode::Opcode((Opcode *)&func_type.field_0x34,CallIndirect);
  this_local._4_4_ = CheckInstr(this,(Opcode)func_type._52_4_,loc);
  FuncType::FuncType((FuncType *)local_70);
  Var::Var(&local_c0,sig_var);
  local_74 = (Enum)CheckFuncTypeIndex(this,&local_c0,(FuncType *)local_70);
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_74);
  Var::~Var(&local_c0);
  Var::Var(&local_110,table_var);
  local_c4 = (Enum)CheckTableIndex(this,&local_110,(TableType *)0x0);
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_c4);
  Var::~Var(&local_110);
  rhs = TypeChecker::OnCallIndirect
                  (&this->typechecker_,(TypeVector *)local_70,
                   (TypeVector *)
                   &func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
  Result::operator|=((Result *)((long)&this_local + 4),rhs);
  FuncType::~FuncType((FuncType *)local_70);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnCallIndirect(const Location& loc,
                                       Var sig_var,
                                       Var table_var) {
  Result result = CheckInstr(Opcode::CallIndirect, loc);
  FuncType func_type;
  result |= CheckFuncTypeIndex(sig_var, &func_type);
  result |= CheckTableIndex(table_var);
  result |= typechecker_.OnCallIndirect(func_type.params, func_type.results);
  return result;
}